

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool calculateSimilartyMap<stSampleMulti<short,4>>
               (int32_t keyPressWidth_samples,int32_t alignWindow_samples,
               int32_t offsetFromPeak_samples,TKeyPressCollectionT<TSampleMI16> *keyPresses,
               TSimilarityMap *res)

{
  bool bVar1;
  size_type sVar2;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> *__lhs;
  vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
  *in_RCX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  thread *in_R8;
  thread *worker_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1_1;
  value_type *worker;
  int iw;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  int nWorkers;
  vector<stMatch,_std::allocator<stMatch>_> *x;
  iterator __end1;
  iterator __begin1;
  TSimilarityMap *__range1;
  int a;
  int w;
  int nPresses;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int iVar3;
  __normal_iterator<std::vector<stMatch,_std::allocator<stMatch>_>_*,_std::vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>_>
  *in_stack_ffffffffffffff00;
  allocator_type *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  in_stack_ffffffffffffff20;
  int local_88;
  vector<std::thread,_std::allocator<std::thread>_> local_70;
  undefined1 local_54 [76];
  undefined4 local_8;
  undefined4 local_4;
  
  local_54._52_8_ = in_R8;
  local_8 = in_ESI;
  local_4 = in_EDI;
  sVar2 = std::
          vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
          ::size(in_RCX);
  local_54._48_4_ = (undefined4)sVar2;
  local_54._44_4_ = local_4;
  local_54._40_4_ = local_8;
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::clear((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           *)0x17c459);
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::resize((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            *)in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18);
  local_54._28_8_ = local_54._52_8_;
  local_54._20_8_ =
       std::
       vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
       ::begin((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_54._12_8_ =
       std::
       vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
       ::end((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff00,
                       (__normal_iterator<std::vector<stMatch,_std::allocator<stMatch>_>_*,_std::vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (!bVar1) break;
    local_54._4_8_ =
         __gnu_cxx::
         __normal_iterator<std::vector<stMatch,_std::allocator<stMatch>_>_*,_std::vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>_>
         ::operator*((__normal_iterator<std::vector<stMatch,_std::allocator<stMatch>_>_*,_std::vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>_>
                      *)(local_54 + 0x14));
    std::vector<stMatch,_std::allocator<stMatch>_>::resize
              ((vector<stMatch,_std::allocator<stMatch>_> *)in_stack_ffffffffffffff20._M_current,
               in_stack_ffffffffffffff18);
    __gnu_cxx::
    __normal_iterator<std::vector<stMatch,_std::allocator<stMatch>_>_*,_std::vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>_>
    ::operator++((__normal_iterator<std::vector<stMatch,_std::allocator<stMatch>_>_*,_std::vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>_>
                  *)(local_54 + 0x14));
  }
  local_54._0_4_ = std::thread::hardware_concurrency();
  __lhs = (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
           *)(long)(int)local_54._0_4_;
  std::allocator<std::thread>::allocator((allocator<std::thread> *)0x17c527);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10);
  std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x17c54d);
  local_88 = 0;
  while( true ) {
    iVar3 = local_88;
    sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&local_70);
    if ((int)sVar2 <= iVar3) break;
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_70,(long)local_88);
    std::thread::
    thread<calculateSimilartyMap<stSampleMulti<short,4>>(int,int,int,stKeyPressCollection<stSampleMulti<short,4>>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::__0,int&,void>
              ((thread *)local_54._52_8_,(type *)local_54,(int *)(local_54 + 0x30));
    std::thread::operator=((thread *)__lhs,(thread *)CONCAT44(iVar3,in_stack_fffffffffffffef8));
    std::thread::~thread((thread *)0x17c626);
    local_88 = local_88 + 1;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::begin
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef8));
  std::vector<std::thread,_std::allocator<std::thread>_>::end
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                              *)CONCAT44(iVar3,in_stack_fffffffffffffef8));
    if (!bVar1) break;
    in_stack_ffffffffffffff10 =
         (allocator_type *)
         __gnu_cxx::
         __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
         operator*((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                    *)&stack0xffffffffffffff20);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                *)&stack0xffffffffffffff20);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffff10);
  return true;
}

Assistant:

bool calculateSimilartyMap(
        const int32_t keyPressWidth_samples,
        const int32_t alignWindow_samples,
        const int32_t offsetFromPeak_samples,
        TKeyPressCollectionT<TSampleMI16> & keyPresses,
        TSimilarityMap & res) {
    int nPresses = keyPresses.size();

    int w = keyPressWidth_samples;
    int a = alignWindow_samples;

    res.clear();
    res.resize(nPresses);
    for (auto & x : res) x.resize(nPresses);

#ifdef __EMSCRIPTEN__
    int nWorkers = std::min(kMaxThreads, std::max(1, int(std::thread::hardware_concurrency()) - 2));
#else
    int nWorkers = std::thread::hardware_concurrency();
#endif

    std::vector<std::thread> workers(nWorkers);
    for (int iw = 0; iw < (int) workers.size(); ++iw) {
        auto & worker = workers[iw];
        worker = std::thread([&](int ith) {
            for (int i = ith; i < nPresses; i += nWorkers) {
                res[i][i].cc = 1.0f;
                res[i][i].offset = 0;

                const auto & waveform0 = keyPresses[i].waveform;
                const auto & pos0      = keyPresses[i].pos;

                auto & avgcc = keyPresses[i].ccAvg;

                const auto samples0 = waveform0.samples;

                for (int j = i + 1; j < nPresses; ++j) {
                    if (i == j) continue;

                    const auto waveform1 = keyPresses[j].waveform;
                    const auto pos1      = keyPresses[j].pos;

                    const auto samples1 = waveform1.samples;
                    const auto ret = findBestCC(TWaveformViewT<TSampleMI16> { samples0 + pos0 + offsetFromPeak_samples - w,     2*w },
                                                TWaveformViewT<TSampleMI16> { samples1 + pos1 + offsetFromPeak_samples - w - a, 2*w + 2*a }, a);

                    const auto bestcc     = std::get<0>(ret);
                    const auto bestoffset = std::get<1>(ret);

                    res[i][j].cc = bestcc;
                    res[i][j].offset = bestoffset;

                    res[j][i].cc = bestcc;
                    res[j][i].offset = -bestoffset;

                    avgcc += bestcc;
                }
                avgcc /= (nPresses - 1);
            }
        }, iw);
    }

    for (auto & worker : workers) worker.join();

    return true;
}